

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_xpcall(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  int errcode;
  TRef tmp;
  TValue argv1;
  TValue argv0;
  int errcode_00;
  lua_State *L;
  undefined8 local_a8;
  long *local_a0;
  long local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 local_8;
  
  if (1 < *(uint *)(in_RDI + 0x8c)) {
    errcode_00 = **(int **)(in_RDI + 0x80);
    **(undefined4 **)(in_RDI + 0x80) = *(undefined4 *)(*(long *)(in_RDI + 0x80) + 4);
    *(int *)(*(long *)(in_RDI + 0x80) + 4) = errcode_00;
    local_8 = *(undefined8 *)(in_RDI + 0x60);
    local_18 = (undefined8 *)*in_RSI;
    local_10 = &local_a8;
    local_a8 = *local_18;
    local_20 = *(undefined8 *)(in_RDI + 0x60);
    local_30 = (undefined8 *)(*in_RSI + 8);
    local_28 = &stack0xffffffffffffff50;
    L = (lua_State *)*local_30;
    local_38 = *(undefined8 *)(in_RDI + 0x60);
    local_40 = (undefined8 *)*in_RSI;
    local_48 = &stack0xffffffffffffff50;
    *local_40 = L;
    local_50 = *(undefined8 *)(in_RDI + 0x60);
    local_58 = (undefined8 *)(*in_RSI + 8);
    local_60 = &local_a8;
    *local_58 = local_a8;
    local_a0 = in_RSI;
    local_98 = in_RDI;
    iVar1 = lj_vm_cpcall(*(undefined8 *)(in_RDI + 0x60),0,in_RDI,recff_xpcall_cp);
    local_68 = *(undefined8 *)(local_98 + 0x60);
    local_70 = (undefined8 *)*local_a0;
    local_78 = &local_a8;
    *local_70 = local_a8;
    local_80 = *(undefined8 *)(local_98 + 0x60);
    local_88 = (undefined8 *)(*local_a0 + 8);
    local_90 = &stack0xffffffffffffff50;
    *local_88 = L;
    if (iVar1 != 0) {
      lj_err_throw(L,errcode_00);
    }
    local_a0[1] = -1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_xpcall(jit_State *J, RecordFFData *rd)
{
  if (J->maxslot >= 2) {
    TValue argv0, argv1;
    TRef tmp;
    int errcode;
    /* Swap function and traceback. */
    tmp = J->base[0]; J->base[0] = J->base[1]; J->base[1] = tmp;
    copyTV(J->L, &argv0, &rd->argv[0]);
    copyTV(J->L, &argv1, &rd->argv[1]);
    copyTV(J->L, &rd->argv[0], &argv1);
    copyTV(J->L, &rd->argv[1], &argv0);
    /* Need to protect lj_record_call because it may throw. */
    errcode = lj_vm_cpcall(J->L, NULL, J, recff_xpcall_cp);
    /* Always undo Lua stack swap to avoid confusing the interpreter. */
    copyTV(J->L, &rd->argv[0], &argv0);
    copyTV(J->L, &rd->argv[1], &argv1);
    if (errcode)
      lj_err_throw(J->L, errcode);  /* Propagate errors. */
    rd->nres = -1;  /* Pending call. */
  }  /* else: Interpreter will throw. */
}